

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

string * __thiscall QHybrid::SoftPrintBrief_abi_cxx11_(QHybrid *this)

{
  long *plVar1;
  ostream *poVar2;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [4];
  Qheur_t in_stack_fffffffffffffe7c;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"QHybrid_");
  qheur::SoftPrint_abi_cxx11_(in_stack_fffffffffffffe7c);
  poVar2 = std::operator<<(poVar2,local_1c8);
  std::operator<<(poVar2,"_");
  std::__cxx11::string::~string(local_1c8);
  if (*(long *)(in_RSI + 0x40) == 0) {
    std::operator<<(local_188,"noQlast");
  }
  else {
    plVar1 = *(long **)(in_RSI + 0x40);
    (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x60)) + 0x48))
              (local_1e8,(long)plVar1 + *(long *)(*plVar1 + -0x60));
    std::operator<<(local_188,local_1e8);
    std::__cxx11::string::~string(local_1e8);
  }
  std::operator<<(local_188,"_hLT");
  if ((*(byte *)(in_RSI + 0x60) & 1) == 0) {
    std::ostream::operator<<(local_188,*(ulong *)(in_RSI + 0x48));
  }
  else {
    std::operator<<(local_188,"0");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string QHybrid::SoftPrintBrief() const
{
    stringstream ss;
    ss << "QHybrid_"
       << SoftPrint(_m_QheurTypeFirstTS)
       << "_";
    if(_m_QlastTimeSteps)
        ss << _m_QlastTimeSteps->SoftPrintBrief();
    else
        ss << "noQlast";
    ss << "_hLT";
    if(_m_optimizedHorLast)
        ss << "0";
    else
        ss <<_m_horizonLastTimeSteps;
    return(ss.str());
}